

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

int Curl_wait_ms(int timeout_ms)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  timeval older;
  timeval newer;
  
  if (timeout_ms == 0) {
    iVar1 = 0;
  }
  else if (timeout_ms < 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    older = curlx_tvnow();
    iVar1 = timeout_ms;
    do {
      iVar1 = poll((pollfd *)0x0,0,iVar1);
      if (iVar1 != -1) goto LAB_004b0d68;
      piVar2 = __errno_location();
      if ((*piVar2 != 0) && ((iVar1 = -1, *piVar2 != 4 || (Curl_ack_eintr != 0))))
      goto LAB_004b0d68;
      newer = curlx_tvnow();
      lVar3 = curlx_tvdiff(newer,older);
      iVar1 = timeout_ms - (int)lVar3;
    } while (iVar1 != 0 && (int)lVar3 <= timeout_ms);
    iVar1 = 0;
LAB_004b0d68:
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

int Curl_wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct timeval initial_tv;
  int pending_ms;
  int error;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = curlx_tvnow();
  do {
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    pending_ms = timeout_ms - elapsed_ms;
    if(pending_ms <= 0) {
      r = 0;  /* Simulate a "call timed out" case */
      break;
    }
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}